

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O0

void __thiscall Network::check_consistency(Network *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  const_reference pvVar4;
  reference puVar5;
  size_type sVar6;
  iterator iStack_30;
  uint node_j;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  Network *pNStack_10;
  uint node_i;
  Network *this_local;
  
  __range2._4_4_ = 0;
  pNStack_10 = this;
  do {
    uVar1 = __range2._4_4_;
    uVar3 = getN(this);
    if (uVar3 <= uVar1) {
      return;
    }
    pvVar4 = std::
             vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->links,(ulong)__range2._4_4_);
    __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       (pvVar4);
    iStack_30 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                          (pvVar4);
    while( true ) {
      bVar2 = std::operator!=(&__end2,&stack0xffffffffffffffd0);
      if (!bVar2) break;
      puVar5 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
      pvVar4 = std::
               vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ::operator[](&this->links,(ulong)*puVar5);
      sVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        (pvVar4,(key_type *)((long)&__range2 + 4));
      if (sVar6 != 1) {
        __assert_fail("links[node_j].count(node_i) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/network.h"
                      ,0x5b,"void Network::check_consistency() const");
      }
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
    }
    __range2._4_4_ = __range2._4_4_ + 1;
  } while( true );
}

Assistant:

void check_consistency() const {
        for (unsigned int node_i = 0; node_i < getN(); node_i++)
            for(unsigned int node_j : links[node_i])
                assert(links[node_j].count(node_i) == 1);
    }